

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<kj::StringPtr&,char_const(&)[3],kj::String&>
          (String *__return_storage_ptr__,kj *this,StringPtr *params,char (*params_1) [3],
          String *params_2)

{
  char *pcVar1;
  ArrayPtr<const_char> local_48;
  undefined8 local_38;
  long local_30;
  ArrayPtr<const_char> local_28;
  
  local_38 = *(undefined8 *)this;
  local_30 = *(long *)(this + 8) + -1;
  local_48.size_ = strlen((char *)params);
  pcVar1 = *(char **)(params_1[2] + 2);
  local_28.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_28.ptr = *(char **)params_1;
  }
  local_28.size_ = (size_t)(char *)0x0;
  if (pcVar1 != (char *)0x0) {
    local_28.size_ = (size_t)(pcVar1 + -1);
  }
  local_48.ptr = (char *)params;
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_38,&local_48,&local_28,
             (ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}